

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O0

void demo::Tracing::ReverseTrace(Tracing *tracer,Formatter *formatter)

{
  Tracing *formatter_00;
  string *psVar1;
  Tracing *in_RSI;
  Tracing *in_RDI;
  Tracing *previous;
  char *in_stack_ffffffffffffffa8;
  Formatter *in_stack_ffffffffffffffb0;
  string *this;
  string local_38 [32];
  
  if (in_RSI != (Tracing *)0x0) {
    if (in_RDI != (Tracing *)0x0) {
      formatter_00 = capture_thread::ThreadCapture<demo::Tracing>::AutoThreadCrosser::Previous
                               ((AutoThreadCrosser *)0x116471);
      ReverseTrace(in_RSI,(Formatter *)formatter_00);
      if (formatter_00 != (Tracing *)0x0) {
        Formatter::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      psVar1 = name_abi_cxx11_(in_RDI);
      this = local_38;
      std::__cxx11::string::string(this,(string *)psVar1);
      Formatter::operator<<
                ((Formatter *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
      std::__cxx11::string::~string(local_38);
    }
    return;
  }
  __assert_fail("formatter",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/demo/tracing.cc"
                ,0x23,"static void demo::Tracing::ReverseTrace(const Tracing *, Formatter *)");
}

Assistant:

void Tracing::ReverseTrace(const Tracing* tracer, Formatter* formatter) {
  assert(formatter);
  if (tracer) {
    const auto previous = tracer->cross_and_capture_to_.Previous();
    ReverseTrace(previous, formatter);
    if (previous) {
      *formatter << ":";
    }
    *formatter << tracer->name();
  }
}